

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_rep.c
# Opt level: O3

nsync_time nsync_time_sleep(nsync_time delay)

{
  int iVar1;
  nsync_time nVar2;
  timespec remain;
  timespec local_20;
  timespec local_10;
  
  local_10.tv_nsec = delay.tv_nsec;
  local_10.tv_sec = delay.tv_sec;
  iVar1 = nanosleep(&local_10,&local_20);
  if (iVar1 == 0) {
    local_20.tv_nsec = 0;
    local_20.tv_sec = 0;
  }
  nVar2.tv_nsec = local_20.tv_nsec;
  nVar2.tv_sec = local_20.tv_sec;
  return nVar2;
}

Assistant:

nsync_time nsync_time_sleep (nsync_time delay) {
	struct timespec ts;
	struct timespec remain;
	memset (&ts, 0, sizeof (ts));
	ts.tv_sec = NSYNC_TIME_SEC (delay);
	ts.tv_nsec = NSYNC_TIME_NSEC (delay);
	if (nanosleep (&ts, &remain) == 0) {
		/* nanosleep() is not required to fill in "remain"
		   if it returns 0. */
		memset (&remain, 0, sizeof (remain));
	}
	return (remain);
}